

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float SliderBehaviorCalcRatioFromValue<double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,float power,
                float linear_zero_pos)

{
  float fVar1;
  double dVar2;
  double dVar3;
  
  fVar1 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    dVar3 = v_max;
    dVar2 = v_min;
    if (v_max <= v_min) {
      dVar3 = v_min;
      dVar2 = v_max;
    }
    if (v <= dVar3) {
      dVar3 = v;
    }
    dVar2 = (double)(~-(ulong)(v < dVar2) & (ulong)dVar3 | (ulong)dVar2 & -(ulong)(v < dVar2));
    if ((power != 1.0) || (NAN(power))) {
      if (0.0 <= dVar2) {
        dVar3 = (double)(~-(ulong)(v_min <= 0.0) & (ulong)v_min);
        fVar1 = powf((float)((dVar2 - dVar3) / (v_max - dVar3)),1.0 / power);
        fVar1 = fVar1 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        dVar3 = 0.0;
        if (v_max <= 0.0) {
          dVar3 = v_max;
        }
        fVar1 = powf(1.0 - (float)((dVar2 - v_min) / (dVar3 - v_min)),1.0 / power);
        fVar1 = (1.0 - fVar1) * linear_zero_pos;
      }
    }
    else {
      fVar1 = (float)((dVar2 - v_min) / (v_max - v_min));
    }
  }
  return fVar1;
}

Assistant:

static inline float SliderBehaviorCalcRatioFromValue(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}